

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int auxupvalue(lua_State *L,int get)

{
  lua_Integer lVar1;
  undefined8 local_38;
  int n;
  char *name;
  int get_local;
  lua_State *L_local;
  
  lVar1 = luaL_checkinteger(L,2);
  luaL_checktype(L,1,6);
  if (get == 0) {
    local_38 = lua_setupvalue(L,1,(int)lVar1);
  }
  else {
    local_38 = lua_getupvalue(L,1,(int)lVar1);
  }
  if (local_38 == (char *)0x0) {
    L_local._4_4_ = 0;
  }
  else {
    lua_pushstring(L,local_38);
    lua_rotate(L,-(get + 1),1);
    L_local._4_4_ = get + 1;
  }
  return L_local._4_4_;
}

Assistant:

static int auxupvalue(lua_State *L, int get) {
    const char *name;
    int n = (int) luaL_checkinteger(L, 2);  /* upvalue index */
    luaL_checktype(L, 1, LUA_TFUNCTION);  /* closure */
    name = get ? lua_getupvalue(L, 1, n) : lua_setupvalue(L, 1, n);
    if (name == NULL) return 0;
    lua_pushstring(L, name);
    lua_insert(L, -(get + 1));  /* no-op if get is false */
    return get + 1;
}